

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

char * spvGeneratorStr(uint32_t generator)

{
  undefined1 *puVar1;
  ulong uVar2;
  
  uVar2 = 0xc;
  puVar1 = (undefined1 *)&DAT_00b32da0;
  do {
    if (*(uint32_t *)((long)puVar1 + -0x40) == generator) {
      puVar1 = (undefined1 *)((long)puVar1 + -0x40);
      goto LAB_005f0adf;
    }
    if (*(uint32_t *)((long)puVar1 + -0x20) == generator) {
      puVar1 = (undefined1 *)((long)puVar1 + -0x20);
      goto LAB_005f0adf;
    }
    if (*(uint32_t *)puVar1 == generator) goto LAB_005f0adf;
    if (*(uint32_t *)((long)puVar1 + 0x20) == generator) {
      puVar1 = (undefined1 *)((long)puVar1 + 0x20);
      goto LAB_005f0adf;
    }
    uVar2 = uVar2 - 1;
    puVar1 = (undefined1 *)((long)puVar1 + 0x80);
  } while (1 < uVar2);
  if (generator - 0x2c < 3) {
    puVar1 = &DAT_008eb324 + *(int *)(&DAT_008eb324 + (ulong)(generator - 0x2c) * 4);
  }
  else {
    puVar1 = (anonymous_namespace)::kOpcodeTable;
  }
LAB_005f0adf:
  if (puVar1 != (anonymous_namespace)::kOpcodeTable) {
    return *(char **)((long)puVar1 + 0x18);
  }
  return "Unknown";
}

Assistant:

const char* spvGeneratorStr(uint32_t generator) {
  auto where = std::find_if(
      std::begin(vendor_tools), std::end(vendor_tools),
      [generator](const VendorTool& vt) { return generator == vt.value; });
  if (where != std::end(vendor_tools)) return where->vendor_tool;
  return "Unknown";
}